

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O3

void aom_fft32x32_float_c(float *input,float *temp,float *output)

{
  ulong uVar1;
  int y;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int x_2;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  
  lVar8 = 0;
  do {
    aom_fft1d_32_float((float *)((long)input + lVar8),(float *)((long)output + lVar8),0x20);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x80);
  lVar8 = 0;
  pfVar2 = temp;
  pfVar3 = output;
  do {
    lVar5 = 0;
    pfVar4 = pfVar3;
    do {
      pfVar2[lVar5] = *pfVar4;
      lVar5 = lVar5 + 1;
      pfVar4 = pfVar4 + 0x20;
    } while (lVar5 != 0x20);
    lVar8 = lVar8 + 1;
    pfVar3 = pfVar3 + 1;
    pfVar2 = pfVar2 + 0x20;
  } while (lVar8 != 0x20);
  lVar8 = 0;
  do {
    aom_fft1d_32_float((float *)((long)temp + lVar8),(float *)((long)output + lVar8),0x20);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x80);
  lVar8 = 0;
  pfVar2 = temp;
  pfVar3 = output;
  do {
    lVar5 = 0;
    pfVar4 = pfVar3;
    do {
      pfVar2[lVar5] = *pfVar4;
      lVar5 = lVar5 + 1;
      pfVar4 = pfVar4 + 0x20;
    } while (lVar5 != 0x20);
    lVar8 = lVar8 + 1;
    pfVar3 = pfVar3 + 1;
    pfVar2 = pfVar2 + 0x20;
  } while (lVar8 != 0x20);
  pfVar4 = temp + 0x210;
  pfVar2 = output + 0x800;
  lVar8 = 0x800;
  lVar5 = 0;
  lVar6 = 0;
  pfVar3 = output;
  do {
    uVar1 = lVar6 - 1;
    uVar7 = 0xffffffffffffffff;
    lVar11 = 0;
    lVar9 = 0;
    do {
      fVar12 = *(float *)((long)pfVar4 + lVar11 * 2 + -0x840);
      if (0xe < uVar7 || 0xe < uVar1) {
        pfVar3[lVar11] = fVar12;
        if (uVar1 < 0xf) {
          lVar10 = (lVar9 + lVar6 * 0x20) * 2;
          goto LAB_004940be;
        }
        lVar10 = lVar5 + lVar11;
        fVar12 = 0.0;
      }
      else {
        lVar10 = lVar5 + lVar11;
        pfVar3[lVar11] = fVar12 - *(float *)((long)pfVar4 + lVar11 * 2);
LAB_004940be:
        fVar12 = *(float *)((long)pfVar4 + lVar11 * 2 + -0x40);
      }
      fVar13 = 0.0;
      if (uVar7 < 0xf) {
        fVar13 = *(float *)((long)pfVar4 + lVar11 * 2 + -0x800);
      }
      output[lVar10 + 1] = fVar12 + fVar13;
      if (uVar1 < 0xf) {
        fVar12 = *(float *)((long)pfVar4 + lVar11 * 2 + -0x840);
        if (0xe < uVar7 || 0xe < uVar1) {
          fVar13 = 0.0;
          pfVar2[lVar11] = fVar12 + 0.0;
          fVar12 = *(float *)((long)pfVar4 + lVar11 * 2 + -0x40);
          if (uVar7 < 0xf) {
            lVar10 = lVar9 * 2 + lVar6 * -0x40 + 0x800;
            goto LAB_00494142;
          }
          lVar10 = lVar8 + lVar11;
        }
        else {
          lVar10 = lVar8 + lVar11;
          pfVar2[lVar11] = fVar12 + *(float *)((long)pfVar4 + lVar11 * 2);
          fVar12 = *(float *)((long)pfVar4 + lVar11 * 2 + -0x40);
LAB_00494142:
          fVar13 = *(float *)((long)pfVar4 + lVar11 * 2 + -0x800);
        }
        output[lVar10 + 1] = fVar13 - fVar12;
      }
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + 2;
      uVar7 = uVar7 + 1;
    } while (lVar11 != 0x22);
    lVar6 = lVar6 + 1;
    pfVar4 = pfVar4 + 0x20;
    lVar8 = lVar8 + -0x40;
    pfVar2 = pfVar2 + -0x40;
    lVar5 = lVar5 + 0x40;
    pfVar3 = pfVar3 + 0x40;
    if (lVar6 == 0x11) {
      return;
    }
  } while( true );
}

Assistant:

void aom_fft32x32_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 32, aom_fft1d_32_float, simple_transpose,
                 unpack_2d_output, 1);
}